

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int perform_getsock(Curl_easy *data,curl_socket_t *sock)

{
  connectdata *pcVar1;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    uVar5 = 0;
  }
  else {
    UNRECOVERED_JUMPTABLE = pcVar1->handler->perform_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar4 = (*UNRECOVERED_JUMPTABLE)(data,pcVar1,sock);
      return iVar4;
    }
    uVar6 = (data->req).keepon & 0x15;
    if (uVar6 == 1) {
      *sock = pcVar1->sockfd;
    }
    uVar5 = (uint)(uVar6 == 1);
    _Var2 = Curl_req_want_send(data);
    if (_Var2) {
      if ((uVar6 == 1) && (pcVar1->sockfd == pcVar1->writesockfd)) {
        bVar3 = 0x10;
      }
      else {
        sock[uVar6 == 1] = pcVar1->writesockfd;
        bVar3 = uVar6 == 1 | 0x10;
      }
      uVar5 = uVar5 | 1 << bVar3;
    }
  }
  return uVar5;
}

Assistant:

static int perform_getsock(struct Curl_easy *data, curl_socket_t *sock)
{
  struct connectdata *conn = data->conn;
  if(!conn)
    return GETSOCK_BLANK;
  else if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(data, conn, sock);
  else {
    /* Default is to obey the data->req.keepon flags for send/recv */
    int bitmap = GETSOCK_BLANK;
    unsigned sockindex = 0;
    if(CURL_WANT_RECV(data)) {
      DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);
      bitmap |= GETSOCK_READSOCK(sockindex);
      sock[sockindex] = conn->sockfd;
    }

    if(Curl_req_want_send(data)) {
      if((conn->sockfd != conn->writesockfd) ||
         bitmap == GETSOCK_BLANK) {
        /* only if they are not the same socket and we have a readable
           one, we increase index */
        if(bitmap != GETSOCK_BLANK)
          sockindex++; /* increase index if we need two entries */

        DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);
        sock[sockindex] = conn->writesockfd;
      }
      bitmap |= GETSOCK_WRITESOCK(sockindex);
    }
    return bitmap;
  }
}